

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDfs.c
# Opt level: O3

void Gia_ManCollectTfi_rec(Gia_Man_t *p,int iObj,Vec_Int_t *vNodes)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  
  if (p->nTravIdsAlloc <= iObj) {
    __assert_fail("Id < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x267,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
  }
  if (p->pTravIds[iObj] != p->nTravIds) {
    p->pTravIds[iObj] = p->nTravIds;
    if ((iObj < 0) || (p->nObjs <= iObj)) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    pGVar1 = p->pObjs;
    uVar2 = (uint)*(undefined8 *)(pGVar1 + (uint)iObj);
    if ((~uVar2 & 0x9fffffff) != 0) {
      if ((-1 < (int)uVar2) && ((uVar2 & 0x1fffffff) != 0x1fffffff)) {
        Gia_ManCollectTfi_rec(p,iObj - (uVar2 & 0x1fffffff),vNodes);
        Gia_ManCollectTfi_rec(p,iObj - (*(uint *)&pGVar1[(uint)iObj].field_0x4 & 0x1fffffff),vNodes)
        ;
        Vec_IntPush(vNodes,iObj);
        return;
      }
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDfs.c"
                    ,0x224,"void Gia_ManCollectTfi_rec(Gia_Man_t *, int, Vec_Int_t *)");
    }
  }
  return;
}

Assistant:

void Gia_ManCollectTfi_rec( Gia_Man_t * p, int iObj, Vec_Int_t * vNodes )
{
    Gia_Obj_t * pObj;
    if ( Gia_ObjIsTravIdCurrentId(p, iObj) )
        return;
    Gia_ObjSetTravIdCurrentId(p, iObj);
    pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjIsCi(pObj) )
        return;
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ManCollectTfi_rec( p, Gia_ObjFaninId0(pObj, iObj), vNodes );
    Gia_ManCollectTfi_rec( p, Gia_ObjFaninId1(pObj, iObj), vNodes );
    Vec_IntPush( vNodes, iObj );
}